

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_gemma2::llm_build_gemma2
          (llm_build_gemma2 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  int iVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *k_cur;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ggml_cgraph *gf_00;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *act_scales;
  ggml_tensor *down_s;
  const_reference pvVar9;
  ggml_tensor *pgVar10;
  pointer plVar11;
  undefined8 in_RCX;
  int *in_RSI;
  long in_RDI;
  float fVar12;
  ggml_tensor *sa_out;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffda8;
  int iVar13;
  llm_graph_context *in_stack_fffffffffffffdb0;
  ggml_tensor *in_stack_fffffffffffffdb8;
  ggml_tensor *in_stack_fffffffffffffdc0;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffdc8;
  undefined4 uVar15;
  ggml_tensor *pgVar14;
  llm_graph_context *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffe00;
  ggml_tensor *in_stack_fffffffffffffe08;
  llm_graph_context *in_stack_fffffffffffffe10;
  ggml_tensor *in_stack_fffffffffffffe28;
  ggml_tensor *in_stack_fffffffffffffe30;
  ggml_tensor *in_stack_fffffffffffffe38;
  ggml_tensor *in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffe48;
  ggml_tensor *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe70;
  ggml_tensor *in_stack_fffffffffffffe90;
  ggml_tensor *in_stack_fffffffffffffe98;
  ggml_tensor *in_stack_fffffffffffffea0;
  ggml_tensor *in_stack_fffffffffffffeb8;
  llm_graph_context *in_stack_fffffffffffffec0;
  ggml_tensor *in_stack_ffffffffffffff78;
  ggml_tensor *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar16;
  ggml_tensor *in_stack_ffffffffffffffb8;
  ggml_tensor *in_stack_ffffffffffffffc0;
  int il_00;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffdc0,
             (llm_graph_params *)in_stack_fffffffffffffdb8);
  uVar1 = *(uint *)(*(long *)(in_RDI + 8) + 0x20);
  pgVar3 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  uVar7 = *(undefined8 *)(in_RDI + 0xc0);
  pgVar10 = pgVar3;
  sqrtf((float)*(long *)(in_RDI + 0x20));
  pgVar3 = (ggml_tensor *)ggml_scale(uVar7,pgVar3);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (char *)in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  k_cur = llm_graph_context::build_inp_pos(in_stack_fffffffffffffe10);
  llm_graph_context::build_attn_inp_kv_unified((llm_graph_context *)in_stack_fffffffffffffe50);
  iVar16 = 0;
  while( true ) {
    iVar13 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    if (*(long *)(in_RDI + 0x28) <= (long)iVar16) {
      pgVar10 = llm_graph_context::build_norm
                          (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                           in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                           (llm_norm_type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                           (int)in_stack_fffffffffffffdb0);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (char *)in_stack_fffffffffffffdb0,iVar13);
      plVar11 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::
                operator->((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                           0x4dc8ee);
      plVar11->t_embd = pgVar10;
      pgVar10 = llm_graph_context::build_lora_mm
                          (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                           in_stack_fffffffffffffe00);
      uVar7 = ggml_scale(1.0 / *(float *)(*(long *)(in_RDI + 8) + 0x1884),
                         *(undefined8 *)(in_RDI + 0xc0),pgVar10);
      uVar7 = ggml_tanh(*(undefined8 *)(in_RDI + 0xc0),uVar7);
      pgVar3 = (ggml_tensor *)
               ggml_scale(*(undefined4 *)(*(long *)(in_RDI + 8) + 0x1884),
                          *(undefined8 *)(in_RDI + 0xc0),uVar7);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (char *)in_stack_fffffffffffffdb0,iVar13);
      pgVar10 = pgVar3;
      plVar11 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::
                operator->((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                           0x4dca27);
      plVar11->t_logits = pgVar3;
      ggml_build_forward_expand(in_RCX,pgVar10);
      return;
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x678),(long)iVar16);
    pgVar4 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                        in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                        (int)in_stack_fffffffffffffdb0);
    il_00 = (int)pgVar4;
    uVar15 = (undefined4)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,iVar13);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x678),(long)iVar16);
    pgVar4 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,iVar13);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x678),(long)iVar16);
    pgVar5 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,iVar13);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x678),(long)iVar16);
    pgVar6 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,iVar13);
    uVar7 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar4,uVar1,
                            *(undefined8 *)(in_RDI + 0x48),(long)*(int *)(in_RDI + 0xa8));
    uVar8 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar5,uVar1,
                            *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    pgVar4 = (ggml_tensor *)
             ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar6,uVar1,
                             *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    uVar7 = ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                          *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                          *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                          *(undefined8 *)(in_RDI + 0xc0),uVar7,k_cur,0,
                          *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    gf_00 = (ggml_cgraph *)
            ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                          *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                          *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                          *(undefined8 *)(in_RDI + 0xc0),uVar8,k_cur,0,
                          *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,iVar13);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,iVar13);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,iVar13);
    iVar2 = *in_RSI;
    if (((iVar2 != 0x1b) && (iVar2 != 0x24)) && (iVar2 != 0x42)) break;
    uVar8 = *(undefined8 *)(in_RDI + 0xc0);
    fVar12 = sqrtf((float)uVar1);
    inp = (llm_graph_input_attn_kv_unified *)ggml_scale(1.0 / fVar12,uVar8,uVar7);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,iVar13);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x678),(long)iVar16);
    pgVar14 = (ggml_tensor *)CONCAT44(uVar15,iVar16);
    mw = (ggml_tensor *)0x0;
    pgVar6 = (ggml_tensor *)0x0;
    llm_graph_context::build_attn
              ((llm_graph_context *)CONCAT44(iVar16,in_stack_ffffffffffffffa0),inp,gf_00,pgVar4,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,k_cur,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffc0,pgVar3,(float)((ulong)pgVar10 >> 0x20),il_00);
    iVar13 = (int)((ulong)gf_00 >> 0x20);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x678),(long)iVar16);
    pgVar5 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdd0,pgVar14,mw,pgVar6,
                        (llm_norm_type)((ulong)pgVar4 >> 0x20),(int)pgVar4);
    llm_graph_context::cb((llm_graph_context *)mw,pgVar6,(char *)pgVar4,iVar13);
    if ((long)iVar16 == *(long *)(in_RDI + 0x28) + -1) {
      in_stack_fffffffffffffea0 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffe00);
      in_stack_ffffffffffffff80 = in_stack_fffffffffffffea0;
      in_stack_fffffffffffffe98 =
           (ggml_tensor *)
           ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar5,in_stack_fffffffffffffea0);
      pgVar5 = in_stack_fffffffffffffe98;
      in_stack_fffffffffffffe90 =
           (ggml_tensor *)
           ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar3,in_stack_ffffffffffffff80);
      pgVar3 = in_stack_fffffffffffffe90;
    }
    act_scales = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar5,pgVar3);
    pgVar5 = act_scales;
    llm_graph_context::cb((llm_graph_context *)mw,pgVar6,(char *)pgVar4,iVar13);
    in_stack_ffffffffffffff78 = pgVar5;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x678),(long)iVar16);
    down_s = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdd0,pgVar14,mw,pgVar6,
                        (llm_norm_type)((ulong)pgVar4 >> 0x20),(int)pgVar4);
    pgVar14 = down_s;
    llm_graph_context::cb((llm_graph_context *)mw,pgVar6,(char *)pgVar4,iVar13);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x678),(long)iVar16);
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x678),
                        (long)iVar16);
    pgVar3 = pvVar9->ffn_gate;
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x678),
                        (long)iVar16);
    in_stack_fffffffffffffdb8 = pvVar9->ffn_down;
    in_stack_fffffffffffffdd0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffdc8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffdc0 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffdb0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffda8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe70 =
         llm_graph_context::build_ffn
                   ((llm_graph_context *)pgVar14,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40
                    ,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                    pgVar3,(ggml_tensor *)&stack0xfffffffffffffda8,in_stack_fffffffffffffe70,pgVar5,
                    down_s,act_scales,(llm_ffn_op_type)in_stack_fffffffffffffe90,
                    (llm_ffn_gate_type)in_stack_fffffffffffffe98,(int)in_stack_fffffffffffffea0);
    in_stack_fffffffffffffe40 = in_stack_fffffffffffffe70;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x678),(long)iVar16);
    in_stack_fffffffffffffe48 =
         llm_graph_context::build_norm
                   (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                    in_stack_fffffffffffffdb8,
                    (llm_norm_type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                    (int)in_stack_fffffffffffffdb0);
    pgVar3 = in_stack_fffffffffffffe48;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    in_stack_fffffffffffffe38 =
         (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar3,in_stack_ffffffffffffff78);
    in_stack_fffffffffffffe30 =
         llm_graph_context::build_cvec(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
    pgVar3 = in_stack_fffffffffffffe30;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (char *)in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    iVar16 = iVar16 + 1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x203f,"fatal error");
}

Assistant:

llm_build_gemma2(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_k;

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        inpL = ggml_scale(ctx0, inpL, sqrtf(n_embd));
        cb(inpL, "inp_scaled", -1);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow);

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow);

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                // ref: https://github.com/google/gemma_pytorch/commit/03e657582d17cb5a8617ebf333c1c16f3694670e
                switch (model.type) {
                    case LLM_TYPE_2B:
                    case LLM_TYPE_9B:
                    case LLM_TYPE_27B: Qcur = ggml_scale(ctx0, Qcur, 1.0f / sqrtf(float(n_embd_head))); break;
                    default: GGML_ABORT("fatal error");
                };
                cb(Qcur, "Qcur_scaled", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f, il);
            }

            cur = build_norm(cur,
                    model.layers[il].attn_post_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_post_norm", il);

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            ggml_tensor * sa_out = ggml_add(ctx0, cur, inpL);
            cb(sa_out, "sa_out", il);

            cur = build_norm(sa_out,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            // feed-forward network
            {
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_GELU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = build_norm(cur,
                    model.layers[il].ffn_post_norm, NULL,
                    LLM_NORM_RMS, -1);
            cb(cur, "ffn_post_norm", -1);

            cur = ggml_add(ctx0, cur, sa_out);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        // final logit soft-capping
        cur = ggml_scale(ctx0, cur, 1.0f / hparams.f_final_logit_softcapping);
        cur = ggml_tanh(ctx0, cur);
        cur = ggml_scale(ctx0, cur, hparams.f_final_logit_softcapping);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }